

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto3_unittest.pb.cc
# Opt level: O1

void __thiscall proto3_unittest::TestProto3BytesMap::~TestProto3BytesMap(TestProto3BytesMap *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal LStack_28;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::
    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Map
              (&(this->field_0)._impl_.map_string_.
                super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.map_);
    google::protobuf::internal::MapFieldBase::~MapFieldBase
              ((MapFieldBase *)&(this->field_0)._impl_.map_string_);
    google::protobuf::
    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Map
              (&(this->field_0)._impl_.map_bytes_.
                super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.map_);
    google::protobuf::internal::MapFieldBase::~MapFieldBase((MapFieldBase *)&(this->field_0)._impl_)
    ;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/map_proto3_unittest.pb.cc"
             ,0x1d0,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

TestProto3BytesMap::~TestProto3BytesMap() {
  // @@protoc_insertion_point(destructor:proto3_unittest.TestProto3BytesMap)
  SharedDtor(*this);
}